

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O2

PrettyPrinterNode * getNextListOnLine(PrettyPrinterNode *start)

{
  PrettyPrinterNode *pPVar1;
  
  if (start->is_line_separator == true) {
    __assert_fail("!start->is_line_separator",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/LispPrint.cpp"
                  ,0x11e,"PrettyPrinterNode *getNextListOnLine(PrettyPrinterNode *)");
  }
  pPVar1 = start->next;
  if ((pPVar1 != (PrettyPrinterNode *)0x0) && (pPVar1->is_line_separator == false)) {
    do {
      if (pPVar1->is_line_separator != false) {
        return (PrettyPrinterNode *)0x0;
      }
      if (pPVar1->line != start->line) {
        return (PrettyPrinterNode *)0x0;
      }
      if (pPVar1->tok->kind == OPEN_PAREN) {
        return pPVar1;
      }
      pPVar1 = pPVar1->next;
    } while (pPVar1 != (PrettyPrinterNode *)0x0);
  }
  return (PrettyPrinterNode *)0x0;
}

Assistant:

static PrettyPrinterNode* getNextListOnLine(PrettyPrinterNode* start) {
  int line = start->line;
  assert(!start->is_line_separator);
  if(!start->next || start->next->is_line_separator) return nullptr;
  start = start->next;
  while(!start->is_line_separator && start->line == line) {
    if(start->tok->kind == TokenKind::OPEN_PAREN) return start;
    if(!start->next) return nullptr;
    start = start->next;
  }
  return nullptr;
}